

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::SeriesMatcher::smokeTest(SeriesMatcher *this,StringSegment *segment)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar3;
  undefined8 *puVar4;
  NumberParseMatcher **matcher;
  undefined8 *puVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[7])()
  ;
  puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[8])
                    (this);
  puVar3 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
  puVar4 = puVar3;
  if (puVar2 != puVar3) {
    puVar4 = (undefined8 *)(**(code **)(*(long *)*puVar2 + 0x20))((long *)*puVar2,segment);
  }
  return (bool)(puVar2 != puVar3 & (byte)puVar4);
}

Assistant:

bool SeriesMatcher::smokeTest(const StringSegment& segment) const {
    // NOTE: The range-based for loop calls the virtual begin() and end() methods.
    // NOTE: We only want the first element. Use the for loop for boundary checking.
    for (auto& matcher : *this) {
        // SeriesMatchers are never allowed to start with a Flexible matcher.
        U_ASSERT(!matcher->isFlexible());
        return matcher->smokeTest(segment);
    }
    return false;
}